

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xss.cpp
# Opt level: O0

bool __thiscall
cppcms::xss::rules_holder<cppcms::xss::icompare_c_string,_false>::valid_boolean_property
          (rules_holder<cppcms::xss::icompare_c_string,_false> *this,c_string *tname,c_string *pname
          )

{
  bool bVar1;
  const_iterator __f;
  map<cppcms::xss::details::c_string,_cppcms::xss::rules_holder<cppcms::xss::icompare_c_string,_false>::tag,_cppcms::xss::icompare_c_string,_std::allocator<std::pair<const_cppcms::xss::details::c_string,_cppcms::xss::rules_holder<cppcms::xss::icompare_c_string,_false>::tag>_>_>
  *in_RDI;
  const_iterator pp;
  const_iterator pt;
  _Self local_38;
  _Self local_30;
  _Self local_28 [4];
  bool local_1;
  
  local_28[0]._M_node =
       (_Base_ptr)
       std::
       map<cppcms::xss::details::c_string,_cppcms::xss::rules_holder<cppcms::xss::icompare_c_string,_false>::tag,_cppcms::xss::icompare_c_string,_std::allocator<std::pair<const_cppcms::xss::details::c_string,_cppcms::xss::rules_holder<cppcms::xss::icompare_c_string,_false>::tag>_>_>
       ::find(in_RDI,(key_type *)0x46513a);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<cppcms::xss::details::c_string,_cppcms::xss::rules_holder<cppcms::xss::icompare_c_string,_false>::tag,_cppcms::xss::icompare_c_string,_std::allocator<std::pair<const_cppcms::xss::details::c_string,_cppcms::xss::rules_holder<cppcms::xss::icompare_c_string,_false>::tag>_>_>
       ::end(in_RDI);
  bVar1 = std::operator==(local_28,&local_30);
  if (bVar1) {
    local_1 = false;
  }
  else {
    std::
    _Rb_tree_const_iterator<std::pair<const_cppcms::xss::details::c_string,_cppcms::xss::rules_holder<cppcms::xss::icompare_c_string,_false>::tag>_>
    ::operator->((_Rb_tree_const_iterator<std::pair<const_cppcms::xss::details::c_string,_cppcms::xss::rules_holder<cppcms::xss::icompare_c_string,_false>::tag>_>
                  *)0x46517a);
    local_38._M_node =
         (_Base_ptr)
         std::
         map<cppcms::xss::details::c_string,_std::function<bool_(const_char_*,_const_char_*)>,_cppcms::xss::icompare_c_string,_std::allocator<std::pair<const_cppcms::xss::details::c_string,_std::function<bool_(const_char_*,_const_char_*)>_>_>_>
         ::find((map<cppcms::xss::details::c_string,_std::function<bool_(const_char_*,_const_char_*)>,_cppcms::xss::icompare_c_string,_std::allocator<std::pair<const_cppcms::xss::details::c_string,_std::function<bool_(const_char_*,_const_char_*)>_>_>_>
                 *)in_RDI,(key_type *)0x46518b);
    std::
    _Rb_tree_const_iterator<std::pair<const_cppcms::xss::details::c_string,_cppcms::xss::rules_holder<cppcms::xss::icompare_c_string,_false>::tag>_>
    ::operator->((_Rb_tree_const_iterator<std::pair<const_cppcms::xss::details::c_string,_cppcms::xss::rules_holder<cppcms::xss::icompare_c_string,_false>::tag>_>
                  *)0x46519a);
    __f = std::
          map<cppcms::xss::details::c_string,_std::function<bool_(const_char_*,_const_char_*)>,_cppcms::xss::icompare_c_string,_std::allocator<std::pair<const_cppcms::xss::details::c_string,_std::function<bool_(const_char_*,_const_char_*)>_>_>_>
          ::end((map<cppcms::xss::details::c_string,_std::function<bool_(const_char_*,_const_char_*)>,_cppcms::xss::icompare_c_string,_std::allocator<std::pair<const_cppcms::xss::details::c_string,_std::function<bool_(const_char_*,_const_char_*)>_>_>_>
                 *)in_RDI);
    bVar1 = std::operator==(&local_38,(_Self *)&stack0xffffffffffffffc0);
    if (bVar1) {
      local_1 = false;
    }
    else {
      std::
      _Rb_tree_const_iterator<std::pair<const_cppcms::xss::details::c_string,_std::function<bool_(const_char_*,_const_char_*)>_>_>
      ::operator->((_Rb_tree_const_iterator<std::pair<const_cppcms::xss::details::c_string,_std::function<bool_(const_char_*,_const_char_*)>_>_>
                    *)0x4651d1);
      bVar1 = std::operator==((function<bool_(const_char_*,_const_char_*)> *)__f._M_node,in_RDI);
      if (bVar1) {
        local_1 = true;
      }
      else {
        local_1 = false;
      }
    }
  }
  return local_1;
}

Assistant:

bool valid_boolean_property(c_string const &tname,c_string const &pname) const
		{
			if(IsXHTML) 
				return false;
			typename tags_type::const_iterator pt = tags.find(tname);
			if(pt==tags.end())
				return false;
			typename properties_type::const_iterator pp = pt->second.properties.find(pname);
			if(pp == pt->second.properties.end())
				return false;
			if(pp->second == nullptr)
				return true;
			return false;
		}